

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_monster(parser *p)

{
  wchar_t wVar1;
  byte *pbVar2;
  char *name_00;
  monster_race *pmVar3;
  prefs_data *d;
  monster_race *monster;
  char *name;
  parser *p_local;
  
  pbVar2 = (byte *)parser_priv(p);
  if (pbVar2 != (byte *)0x0) {
    if ((*pbVar2 & 1) == 0) {
      name_00 = parser_getsym(p,"name");
      pmVar3 = lookup_monster(name_00);
      if (pmVar3 == (monster_race *)0x0) {
        p_local._4_4_ = PARSE_ERROR_NO_KIND_FOUND;
      }
      else {
        wVar1 = parser_getint(p,"attr");
        monster_x_attr[pmVar3->ridx] = (uint8_t)wVar1;
        wVar1 = parser_getint(p,"char");
        monster_x_char[pmVar3->ridx] = wVar1;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x2b0,"enum parser_error parse_prefs_monster(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_monster(struct parser *p)
{
	const char *name;
	struct monster_race *monster;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	monster = lookup_monster(name);
	if (!monster)
		return PARSE_ERROR_NO_KIND_FOUND;

	monster_x_attr[monster->ridx] = (uint8_t)parser_getint(p, "attr");
	monster_x_char[monster->ridx] = (wchar_t)parser_getint(p, "char");

	return PARSE_ERROR_NONE;
}